

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int precedence(string *token)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::operator==(token,"=");
  if (bVar1) {
    iVar2 = 1;
  }
  else {
    bVar1 = std::operator==(token,"+");
    iVar2 = 2;
    if ((!bVar1) && (bVar1 = std::operator==(token,"-"), !bVar1)) {
      bVar1 = std::operator==(token,"*");
      if (bVar1) {
        iVar2 = 3;
      }
      else {
        bVar1 = std::operator==(token,"/");
        iVar2 = (uint)bVar1 + (uint)bVar1 * 2;
      }
    }
  }
  return iVar2;
}

Assistant:

int precedence(string token) {
   if (token == "=") return 1;
   if (token == "+" || token == "-") return 2;
   if (token == "*" || token == "/") return 3;
   return 0;
}